

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.cpp
# Opt level: O1

int __thiscall ncnn::Exp::forward_inplace(Exp *this,Mat *bottom_top_blob,Option *opt)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  void *pvVar7;
  float fVar8;
  
  uVar1 = bottom_top_blob->c;
  uVar4 = bottom_top_blob->h * bottom_top_blob->w;
  if (this->base == -1.0) {
    if (0 < (int)uVar1) {
      pvVar7 = bottom_top_blob->data;
      sVar2 = bottom_top_blob->cstep;
      sVar3 = bottom_top_blob->elemsize;
      uVar6 = 0;
      do {
        if (0 < (int)uVar4) {
          uVar5 = 0;
          do {
            fVar8 = expf(this->scale * *(float *)((long)pvVar7 + uVar5 * 4) + this->shift);
            *(float *)((long)pvVar7 + uVar5 * 4) = fVar8;
            uVar5 = uVar5 + 1;
          } while (uVar4 != uVar5);
        }
        uVar6 = uVar6 + 1;
        pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
      } while (uVar6 != uVar1);
    }
  }
  else if (0 < (int)uVar1) {
    pvVar7 = bottom_top_blob->data;
    sVar2 = bottom_top_blob->cstep;
    sVar3 = bottom_top_blob->elemsize;
    uVar6 = 0;
    do {
      if (0 < (int)uVar4) {
        uVar5 = 0;
        do {
          fVar8 = powf(this->base,this->scale * *(float *)((long)pvVar7 + uVar5 * 4) + this->shift);
          *(float *)((long)pvVar7 + uVar5 * 4) = fVar8;
          uVar5 = uVar5 + 1;
        } while (uVar4 != uVar5);
      }
      uVar6 = uVar6 + 1;
      pvVar7 = (void *)((long)pvVar7 + sVar2 * sVar3);
    } while (uVar6 != uVar1);
  }
  return 0;
}

Assistant:

int Exp::forward_inplace(Mat& bottom_top_blob, const Option& opt) const
{
    int w = bottom_top_blob.w;
    int h = bottom_top_blob.h;
    int channels = bottom_top_blob.c;
    int size = w * h;

    if (base == -1.f)
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = exp(shift + ptr[i] * scale);
            }
        }
    }
    else
    {
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            float* ptr = bottom_top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                ptr[i] = pow(base, (shift + ptr[i] * scale));
            }
        }
    }

    return 0;
}